

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

string * makeTemp(string *__return_storage_ptr__,string *prefix)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  char local_64;
  uint local_30;
  uint i;
  allocator<char> local_1a;
  undefined1 local_19;
  string *local_18;
  string *prefix_local;
  string *result;
  
  local_19 = 0;
  local_18 = prefix;
  prefix_local = __return_storage_ptr__;
  lVar2 = std::__cxx11::string::length();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,lVar2 + 8,' ',&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  for (local_30 = 0; uVar3 = std::__cxx11::string::length(), local_30 < uVar3;
      local_30 = local_30 + 1) {
    uVar3 = std::__cxx11::string::length();
    if (local_30 < uVar3) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
      local_64 = *pcVar4;
    }
    else {
      iVar1 = rand();
      local_64 = (char)(iVar1 % 0x1a) + 'a';
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pcVar4 = local_64;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string makeTemp(const std::string& prefix)
{
    std::string result(prefix.length() + 8, ' ');
    for (unsigned i = 0; i < result.length(); i++) {
        result[i] = i < prefix.length() ? prefix[i] : ('a' + (rand() % 26));
    }
    return result;
}